

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O1

LY_ERR iff_stack_push(iff_stack *stack,uint8_t value)

{
  uint8_t *puVar1;
  size_t extraout_RAX;
  size_t sVar2;
  
  if (stack->index == stack->size) {
    sVar2 = stack->size + 4;
    stack->size = sVar2;
    puVar1 = (uint8_t *)ly_realloc(stack->stack,sVar2);
    stack->stack = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","iff_stack_push");
      stack->size = 0;
      sVar2 = extraout_RAX;
      goto LAB_00156cc3;
    }
  }
  sVar2 = stack->index;
  stack->index = sVar2 + 1;
  stack->stack[sVar2] = value;
LAB_00156cc3:
  return (LY_ERR)sVar2;
}

Assistant:

static LY_ERR
iff_stack_push(struct iff_stack *stack, uint8_t value)
{
    if (stack->index == stack->size) {
        stack->size += IFF_STACK_SIZE_STEP;
        stack->stack = ly_realloc(stack->stack, stack->size * sizeof *stack->stack);
        LY_CHECK_ERR_RET(!stack->stack, LOGMEM(NULL); stack->size = 0, LY_EMEM);
    }
    stack->stack[stack->index++] = value;
    return LY_SUCCESS;
}